

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O2

void ggml::cpu::aarch64::gemv<block_q4_0,8l,4l,(ggml_type)8>
               (int n,float *s,size_t bs,void *vx,void *vy,int nr,int nc)

{
  uint uVar1;
  undefined1 auVar2 [16];
  void *pvVar3;
  int j;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int i;
  long lVar10;
  int l;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  int k;
  long lVar14;
  long lVar15;
  long lVar16;
  float afStack_98 [4];
  long local_88;
  long local_80;
  long local_78;
  void *local_70;
  float sumf [4];
  
  uVar12 = n / 0x20;
  local_78 = (long)(int)uVar12;
  local_70 = vx;
  lVar7 = (long)vx + 8;
  local_80 = (long)vy + 0x12;
  local_88 = (long)(int)uVar12 * 0x48;
  uVar11 = (ulong)(uint)(~(nc / 4 >> 0x1f) & nc / 4);
  sumf[0] = (float)(int)uVar11;
  sumf[1] = (float)(int)(uVar11 >> 0x20);
  lVar8 = 0;
  while (lVar8 != sumf._0_8_) {
    for (lVar4 = 0; pvVar3 = local_70, lVar4 != 4; lVar4 = lVar4 + 1) {
      afStack_98[lVar4] = 0.0;
    }
    lVar5 = lVar8 * local_78;
    sumf[2] = (float)(int)lVar8;
    sumf[3] = (float)(int)((ulong)lVar8 >> 0x20);
    lVar8 = lVar7;
    lVar4 = local_80;
    for (uVar11 = 0; uVar11 != (~((int)uVar12 >> 0x1f) & uVar12); uVar11 = uVar11 + 1) {
      uVar1 = *(uint *)(&ggml_table_f32_f16 + (ulong)*(ushort *)((long)vy + uVar11 * 0x22) * 4);
      lVar13 = lVar8;
      lVar16 = lVar4;
      for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
        lVar15 = lVar13;
        for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
          iVar9 = 0;
          for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
            iVar9 = iVar9 + ((int)((int)*(char *)(lVar16 + lVar10) *
                                   ((int)*(char *)(lVar15 + lVar10) & 0xfffffff0U) +
                                  (int)*(char *)(lVar16 + -0x10 + lVar10) *
                                  (int)(char)(*(char *)(lVar15 + lVar10) << 4)) >> 4);
          }
          lVar15 = lVar15 + 8;
          auVar2 = vfmadd213ss_fma(ZEXT416((uint)((float)iVar9 *
                                                 *(float *)(&ggml_table_f32_f16 +
                                                           (ulong)*(ushort *)
                                                                   ((long)pvVar3 +
                                                                   lVar6 * 2 +
                                                                   uVar11 * 0x48 + lVar5 * 0x48) * 4
                                                           ))),ZEXT416(uVar1),
                                   ZEXT416((uint)afStack_98[lVar6]));
          afStack_98[lVar6] = auVar2._0_4_;
        }
        lVar16 = lVar16 + 8;
        lVar13 = lVar13 + 0x20;
      }
      lVar4 = lVar4 + 0x22;
      lVar8 = lVar8 + 0x48;
    }
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      s[lVar8] = afStack_98[lVar8];
    }
    lVar7 = lVar7 + local_88;
    s = s + 4;
    lVar8 = sumf._8_8_ + 1;
  }
  return;
}

Assistant:

void gemv<block_q4_0, 8, 4, GGML_TYPE_Q8_0>(int n, float * s, size_t bs, const void * vx, const void * vy, int nr, int nc) {
    ggml_gemv_q4_0_4x8_q8_0(n, s, bs, vx, vy, nr, nc);
}